

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O0

void __thiscall TypeCheckingVisitor::Visit(TypeCheckingVisitor *this,LogicalExpression *expression)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  runtime_error *prVar5;
  allocator<char> local_f1;
  key_type local_f0;
  allocator<char> local_c9;
  key_type local_c8;
  allocator<char> local_a1;
  key_type local_a0;
  int local_80;
  allocator<char> local_79;
  int type_code_2;
  int local_58;
  int type_code_1;
  allocator<char> local_41;
  key_type local_40;
  int local_1c;
  LogicalExpression *pLStack_18;
  int type_code;
  LogicalExpression *expression_local;
  TypeCheckingVisitor *this_local;
  
  pLStack_18 = expression;
  expression_local = (LogicalExpression *)this;
  bVar2 = std::operator==(&expression->operation_,"&&");
  if ((((bVar2) || (bVar2 = std::operator==(&pLStack_18->operation_,"||"), bVar2)) ||
      (bVar2 = std::operator==(&pLStack_18->operation_,"!"), bVar2)) ||
     ((bVar2 = std::operator==(&pLStack_18->operation_,"true"), bVar2 ||
      (bVar2 = std::operator==(&pLStack_18->operation_,"false"), bVar2)))) {
    if (pLStack_18->lhs_ != (Expression *)0x0) {
      iVar3 = TemplateVisitor<int>::Accept
                        ((TemplateVisitor<int> *)this,&pLStack_18->lhs_->super_Node);
      local_1c = iVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"boolean",&local_41);
      pmVar4 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->type_system_,&local_40);
      iVar1 = *pmVar4;
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
      if (iVar3 != iVar1) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Non-boolean type in logical expression");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if (pLStack_18->rhs_ != (Expression *)0x0) {
      iVar3 = TemplateVisitor<int>::Accept
                        ((TemplateVisitor<int> *)this,&pLStack_18->rhs_->super_Node);
      local_58 = iVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&type_code_2,"boolean",&local_79)
      ;
      pmVar4 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->type_system_,(key_type *)&type_code_2);
      iVar1 = *pmVar4;
      std::__cxx11::string::~string((string *)&type_code_2);
      std::allocator<char>::~allocator(&local_79);
      if (iVar3 != iVar1) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Non-boolean type in logical expression");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    iVar3 = TemplateVisitor<int>::Accept((TemplateVisitor<int> *)this,&pLStack_18->lhs_->super_Node)
    ;
    local_80 = iVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"int",&local_a1);
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->type_system_,&local_a0);
    iVar1 = *pmVar4;
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    if (iVar3 != iVar1) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Non-int type in comparison");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = TemplateVisitor<int>::Accept((TemplateVisitor<int> *)this,&pLStack_18->rhs_->super_Node)
    ;
    local_80 = iVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"int",&local_c9);
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->type_system_,&local_c8);
    iVar1 = *pmVar4;
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    if (iVar3 != iVar1) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Non-int type in comparison");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"boolean",&local_f1);
  pmVar4 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->type_system_,&local_f0);
  (this->super_TemplateVisitor<int>).tos_value_ = *pmVar4;
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  return;
}

Assistant:

void TypeCheckingVisitor::Visit(LogicalExpression* expression) {
  if (expression->operation_ == "&&" || expression->operation_ == "||" ||
      expression->operation_ == "!" || expression->operation_ == "true" ||
      expression->operation_ == "false") {
    if (expression->lhs_) {
      int type_code = Accept(expression->lhs_);

      if (type_code != type_system_["boolean"]) {
        throw std::runtime_error("Non-boolean type in logical expression");
      }
    }
    if (expression->rhs_) {
      int type_code = Accept(expression->rhs_);

      if (type_code != type_system_["boolean"]) {
        throw std::runtime_error("Non-boolean type in logical expression");
      }
    }
  } else {
    int type_code = Accept(expression->lhs_);

    if (type_code != type_system_["int"]) {
      throw std::runtime_error("Non-int type in comparison");
    }

    type_code = Accept(expression->rhs_);

    if (type_code != type_system_["int"]) {
      throw std::runtime_error("Non-int type in comparison");
    }
  }

  tos_value_ = type_system_["boolean"];
}